

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O1

void __thiscall
rapidjson::
GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
::DoesNotMatch(GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
               *this,Ch *str,SizeType length)

{
  StringRefType *pSVar1;
  CrtAllocator *pCVar2;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> local_40;
  StringRefType local_30;
  
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::~GenericValue(&this->currentError_);
  (this->currentError_).data_.n = (Number)0x0;
  (this->currentError_).data_.s.str = (Ch *)0x0;
  (this->currentError_).data_.f.flags = 3;
  pSVar1 = GetActualString();
  local_30.s = pSVar1->s;
  local_30.length = pSVar1->length;
  if (this->stateAllocator_ == (CrtAllocator *)0x0) {
    pCVar2 = (CrtAllocator *)operator_new(1);
    this->ownStateAllocator_ = pCVar2;
    this->stateAllocator_ = pCVar2;
  }
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GenericValue
            (&local_40,str,length,this->stateAllocator_);
  if (this->stateAllocator_ == (CrtAllocator *)0x0) {
    pCVar2 = (CrtAllocator *)operator_new(1);
    this->ownStateAllocator_ = pCVar2;
    this->stateAllocator_ = pCVar2;
  }
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::AddMember
            (&this->currentError_,&local_30,&local_40,this->stateAllocator_);
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::~GenericValue(&local_40);
  AddCurrentError(this,kValidateErrorPattern,false);
  return;
}

Assistant:

void DoesNotMatch(const Ch* str, SizeType length) {
        currentError_.SetObject();
        currentError_.AddMember(GetActualString(), ValueType(str, length, GetStateAllocator()).Move(), GetStateAllocator());
        AddCurrentError(kValidateErrorPattern);
    }